

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

char * kvtree_get_val(kvtree *hash,char *key)

{
  uint uVar1;
  kvtree *hash_00;
  
  hash_00 = kvtree_get(hash,key);
  if (hash_00 != (kvtree *)0x0) {
    uVar1 = kvtree_size(hash_00);
    if (uVar1 != 1) {
      kvtree_err("Hash for key %s expected to have exactly one element, but it has %d @ %s:%d",key,
                 (ulong)uVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x3ac);
      return (char *)0x0;
    }
    if (hash_00->lh_first != (kvtree_elem_struct *)0x0) {
      return hash_00->lh_first->key;
    }
  }
  return (char *)0x0;
}

Assistant:

char* kvtree_get_val(const kvtree* hash, const char* key)
{
  char* value = NULL;

  /* check whether the specified key is even set */
  kvtree* key_hash = kvtree_get(hash, key);
  if (key_hash != NULL) {
    /* check that the size of this hash belonging to the key is
     * exactly 1 */
    int size = kvtree_size(key_hash);
    if (size == 1) {
      /* get the key of the first element in this hash */
      kvtree_elem* first = kvtree_elem_first(key_hash);
      value = kvtree_elem_key(first);
    } else {
      /* this is an error */
      kvtree_err("Hash for key %s expected to have exactly one element, but it has %d @ %s:%d",
        key, size, __FILE__, __LINE__
      );
    }
  }

  return value;
}